

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O2

bool cppurses::System::send_event(Event *event)

{
  bool bVar1;
  int iVar2;
  
  if (event->receiver_->enabled_ == false) {
    if (Delete < event->type_) {
      return false;
    }
    if ((0xc0200U >> (event->type_ & (ChildPolished|ChildRemoved)) & 1) == 0) {
      return false;
    }
  }
  bVar1 = Event::send_to_all_filters(event);
  if (bVar1) {
    return true;
  }
  iVar2 = (*event->_vptr_Event[2])(event);
  return SUB41(iVar2,0);
}

Assistant:

static auto send_event(const Event& event) -> bool
    {
        if (!detail::is_sendable(event))
            return false;
        bool handled = event.send_to_all_filters();
        if (!handled)
            handled = event.send();
        return handled;
    }